

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::ProcessUse(BackwardPass *this,Opnd *opnd)

{
  StackSym *sym;
  Instr *pIVar1;
  RegOpnd *opnd_00;
  Sym *sym_00;
  GlobOpt *this_00;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  BOOLEAN BVar5;
  BailOutKind BVar6;
  RegOpnd *pRVar7;
  ArrayRegOpnd *pAVar8;
  undefined4 *puVar9;
  IndirOpnd *pIVar10;
  SymOpnd *this_01;
  SymOpnd *this_02;
  PropertySymOpnd *pPVar11;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a [4];
  ValueType valueType;
  
  OVar3 = IR::Opnd::GetKind(opnd);
  if (OVar3 == OpndKindSym) {
    this_01 = IR::Opnd::AsSymOpnd(opnd);
    sym_00 = this_01->m_sym;
    bVar4 = ProcessSymUse(this,sym_00,false,(byte)opnd->field_0xb >> 3 & 1);
    DoSetDead(this,&this_01->super_Opnd,!bVar4);
    if (this->isCollectionPass != false) {
      return;
    }
    if (sym_00->m_kind != SymKindProperty) {
      return;
    }
    if (this->tag == BackwardPhase) {
      this_02 = IR::Opnd::AsSymOpnd(opnd);
      bVar4 = IR::SymOpnd::IsPropertySymOpnd(this_02);
      if (bVar4) {
        this_00 = this->globOpt;
        pPVar11 = IR::Opnd::AsPropertySymOpnd(&this_01->super_Opnd);
        GlobOpt::PreparePropertySymOpndForTypeCheckSeq
                  (this_00,pPVar11,this->currentInstr,this->currentBlock->loop);
      }
    }
    DoMarkTempNumbersOnTempObjects(this);
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(this_01);
    if (!bVar4) {
      return;
    }
    pPVar11 = IR::Opnd::AsPropertySymOpnd(&this_01->super_Opnd);
    ProcessPropertySymOpndUse(this,pPVar11);
    return;
  }
  if (OVar3 == OpndKindIndir) {
    pIVar10 = IR::Opnd::AsIndirOpnd(opnd);
    pRVar7 = pIVar10->m_baseOpnd;
    bVar4 = ProcessSymUse(this,&pRVar7->m_sym->super_Sym,false,
                          (byte)(pRVar7->super_Opnd).field_0xb >> 3 & 1);
    DoSetDead(this,&pRVar7->super_Opnd,!bVar4);
    opnd_00 = pIVar10->m_indexOpnd;
    if (opnd_00 != (RegOpnd *)0x0) {
      bVar4 = ProcessSymUse(this,&opnd_00->m_sym->super_Sym,false,
                            (byte)(opnd_00->super_Opnd).field_0xb >> 3 & 1);
      DoSetDead(this,&opnd_00->super_Opnd,!bVar4);
    }
    if (this->isCollectionPass != false) {
      return;
    }
    DoMarkTempNumbersOnTempObjects(this);
    if (this->tag != DeadStorePhase) {
      return;
    }
    bVar4 = IR::RegOpnd::IsArrayRegOpnd(pRVar7);
    if (!bVar4) {
      return;
    }
    pIVar1 = this->currentInstr;
    pAVar8 = IR::RegOpnd::AsArrayRegOpnd(pRVar7);
    ProcessArrayRegOpndUse(this,pIVar1,pAVar8);
    return;
  }
  if (OVar3 != OpndKindReg) {
    return;
  }
  pRVar7 = IR::Opnd::AsRegOpnd(opnd);
  sym = pRVar7->m_sym;
  if (this->isCollectionPass == false) {
    if ((pRVar7->field_0x18 & 1) != 0) {
      local_2c = (pRVar7->super_Opnd).m_valueType.field_0;
      bVar4 = ValueType::IsNotString((ValueType *)&local_2c.field_0);
      if (((bVar4) ||
          (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                             (this->currentBlock->upwardExposedUses,(sym->super_Sym).m_id),
          BVar5 != '\0')) || ((*(uint *)&sym->field_0x18 >> 0x13 & 1) != 0)) {
        pRVar7->field_0x18 = pRVar7->field_0x18 & 0xfe;
      }
    }
    CollectCloneStrCandidate(this,opnd);
  }
  bVar4 = ProcessSymUse(this,&sym->super_Sym,false,(byte)(pRVar7->super_Opnd).field_0xb >> 3 & 1);
  DoSetDead(this,&pRVar7->super_Opnd,!bVar4);
  if (this->isCollectionPass == false) {
    if ((this->tag == DeadStorePhase) && (bVar4 = IR::RegOpnd::IsArrayRegOpnd(pRVar7), bVar4)) {
      pIVar1 = this->currentInstr;
      pAVar8 = IR::RegOpnd::AsArrayRegOpnd(pRVar7);
      ProcessArrayRegOpndUse(this,pIVar1,pAVar8);
    }
    if (this->currentInstr->m_opcode != BailOnNotArray) {
      return;
    }
    if (this->tag != DeadStorePhase) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1887,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
      if (!bVar4) goto LAB_003cec59;
      *puVar9 = 0;
    }
    local_2a[0] = (pRVar7->super_Opnd).m_valueType.field_0;
    bVar4 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)&local_2a[0].field_0);
    if (bVar4) {
      BVSparse<Memory::JitArenaAllocator>::Clear
                (this->currentBlock->noImplicitCallUses,(sym->super_Sym).m_id);
      bVar4 = ValueType::HasNoMissingValues((ValueType *)&local_2a[0].field_0);
      if (((bVar4) &&
          (bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                             (this->currentBlock->noImplicitCallNoMissingValuesUses), !bVar4)) &&
         (this->currentPrePassLoop == (Loop *)0x0)) {
        BVar6 = IR::Instr::GetBailOutKind(this->currentInstr);
        if ((BVar6 != BailOutOnNotArray) &&
           (BVar6 = IR::Instr::GetBailOutKind(this->currentInstr), BVar6 != BailOutOnNotNativeArray)
           ) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1898,
                             "(currentInstr->GetBailOutKind() == IR::BailOutOnNotArray || currentInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray)"
                             ,
                             "currentInstr->GetBailOutKind() == IR::BailOutOnNotArray || currentInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray"
                            );
          if (!bVar4) {
LAB_003cec59:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar9 = 0;
        }
        pIVar1 = this->currentInstr;
        BVar6 = IR::Instr::GetBailOutKind(pIVar1);
        IR::Instr::SetBailOutKind(pIVar1,BVar6 | BailOutOnMissingValue);
      }
      BVSparse<Memory::JitArenaAllocator>::Clear
                (this->currentBlock->noImplicitCallNoMissingValuesUses,(sym->super_Sym).m_id);
      BVSparse<Memory::JitArenaAllocator>::Clear
                (this->currentBlock->noImplicitCallNativeArrayUses,(sym->super_Sym).m_id);
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessUse(IR::Opnd * opnd)
{
    switch (opnd->GetKind())
    {
    case IR::OpndKindReg:
        {
            IR::RegOpnd *regOpnd = opnd->AsRegOpnd();
            StackSym *sym = regOpnd->m_sym;

            if (!IsCollectionPass())
            {
                // isTempLastUse is only used for string concat right now, so lets not mark it if it's not a string.
                // If it's upward exposed, it is not it's last use.
                if (regOpnd->m_isTempLastUse && (regOpnd->GetValueType().IsNotString() || this->currentBlock->upwardExposedUses->Test(sym->m_id) || sym->m_mayNotBeTempLastUse))
                {
                    regOpnd->m_isTempLastUse = false;
                }
                this->CollectCloneStrCandidate(opnd);
            }

            this->DoSetDead(regOpnd, !this->ProcessSymUse(sym, true, regOpnd->GetIsJITOptimizedReg()));

            if (IsCollectionPass())
            {
                break;
            }

            if (tag == Js::DeadStorePhase && regOpnd->IsArrayRegOpnd())
            {
                ProcessArrayRegOpndUse(currentInstr, regOpnd->AsArrayRegOpnd());
            }

            if (currentInstr->m_opcode == Js::OpCode::BailOnNotArray)
            {
                Assert(tag == Js::DeadStorePhase);

                const ValueType valueType(regOpnd->GetValueType());
                if(valueType.IsLikelyArrayOrObjectWithArray())
                {
                    currentBlock->noImplicitCallUses->Clear(sym->m_id);

                    // We are being conservative here to always check for missing value
                    // if any of them expect no missing value. That is because we don't know
                    // what set of sym is equivalent (copied) from the one we are testing for right now.
                    if(valueType.HasNoMissingValues() &&
                        !currentBlock->noImplicitCallNoMissingValuesUses->IsEmpty() &&
                        !IsPrePass())
                    {
                        // There is a use of this sym that requires this array to have no missing values, so this instruction
                        // needs to bail out if the array has missing values.
                        Assert(currentInstr->GetBailOutKind() == IR::BailOutOnNotArray ||
                               currentInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray);
                        currentInstr->SetBailOutKind(currentInstr->GetBailOutKind() | IR::BailOutOnMissingValue);
                    }

                    currentBlock->noImplicitCallNoMissingValuesUses->Clear(sym->m_id);
                    currentBlock->noImplicitCallNativeArrayUses->Clear(sym->m_id);
                }
            }
        }
        break;
    case IR::OpndKindSym:
        {
            IR::SymOpnd *symOpnd = opnd->AsSymOpnd();
            Sym * sym = symOpnd->m_sym;

            this->DoSetDead(symOpnd, !this->ProcessSymUse(sym, false, opnd->GetIsJITOptimizedReg()));

            if (IsCollectionPass())
            {
                break;
            }

            if (sym->IsPropertySym())
            {
                // TODO: We don't have last use info for property sym
                // and we don't set the last use of the stacksym inside the property sym
                if (tag == Js::BackwardPhase)
                {
                    if (opnd->AsSymOpnd()->IsPropertySymOpnd())
                    {
                        this->globOpt->PreparePropertySymOpndForTypeCheckSeq(symOpnd->AsPropertySymOpnd(), this->currentInstr, this->currentBlock->loop);
                    }
                }

                if (this->DoMarkTempNumbersOnTempObjects())
                {
                    this->currentBlock->tempNumberTracker->ProcessPropertySymUse(symOpnd, this->currentInstr, this);
                }

                if (symOpnd->IsPropertySymOpnd())
                {
                    this->ProcessPropertySymOpndUse(symOpnd->AsPropertySymOpnd());
                }
            }
        }
        break;
    case IR::OpndKindIndir:
        {
            IR::IndirOpnd * indirOpnd = opnd->AsIndirOpnd();
            IR::RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();

            this->DoSetDead(baseOpnd, !this->ProcessSymUse(baseOpnd->m_sym, false, baseOpnd->GetIsJITOptimizedReg()));

            IR::RegOpnd * indexOpnd = indirOpnd->GetIndexOpnd();
            if (indexOpnd)
            {
                this->DoSetDead(indexOpnd, !this->ProcessSymUse(indexOpnd->m_sym, false, indexOpnd->GetIsJITOptimizedReg()));
            }

            if(IsCollectionPass())
            {
                break;
            }

            if (this->DoMarkTempNumbersOnTempObjects())
            {
                this->currentBlock->tempNumberTracker->ProcessIndirUse(indirOpnd, currentInstr, this);
            }

            if(tag == Js::DeadStorePhase && baseOpnd->IsArrayRegOpnd())
            {
                ProcessArrayRegOpndUse(currentInstr, baseOpnd->AsArrayRegOpnd());
            }
        }
        break;
    }
}